

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O2

Background * __thiscall
Rml::ElementBackgroundBorder::GetOrCreateBackground
          (ElementBackgroundBorder *this,BackgroundType type)

{
  iterator iVar1;
  Background *pBVar2;
  key_type local_14;
  
  iVar1 = ::std::
          _Rb_tree<Rml::ElementBackgroundBorder::BackgroundType,_std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>,_std::_Select1st<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
          ::find(&(this->backgrounds)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->backgrounds)._M_t._M_impl.super__Rb_tree_header) {
    pBVar2 = ::std::
             map<Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
             ::operator[](&this->backgrounds,&local_14);
  }
  else {
    pBVar2 = (Background *)&iVar1._M_node[1]._M_parent;
  }
  return pBVar2;
}

Assistant:

ElementBackgroundBorder::Background& ElementBackgroundBorder::GetOrCreateBackground(BackgroundType type)
{
	auto it = backgrounds.find(type);
	if (it != backgrounds.end())
		return it->second;

	Background& background = backgrounds[type];
	return background;
}